

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void __thiscall ast::Section::write_block(Section *this,uint offset,uint8_t *data,uint size)

{
  uint new_capacity;
  uint limit_superior;
  uint size_local;
  uint8_t *data_local;
  uint offset_local;
  Section *this_local;
  
  new_capacity = offset + size;
  while (this->content_capacity < new_capacity) {
    enlarge(this,new_capacity);
  }
  memcpy(this->content + offset,data,(ulong)size);
  if (this->content_size < new_capacity) {
    this->content_size = (new_capacity - this->content_size) + this->content_size;
  }
  return;
}

Assistant:

void Section::write_block(unsigned offset, const uint8_t *data, unsigned size)
{
	auto limit_superior = offset + size;
	while (limit_superior > content_capacity)
		enlarge(limit_superior);
	memcpy(content + offset, data, size);
	if (limit_superior > content_size)
		content_size += limit_superior - content_size;
}